

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  undefined8 uVar1;
  ssize_t sVar2;
  Curl_easy *data_00;
  char *pcVar3;
  curltime cVar4;
  size_t local_88;
  undefined4 uStack_6c;
  timediff_t old_time;
  size_t pathLen;
  char *rawPath;
  CURLcode result;
  int ftpcode;
  ssize_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  FTP *ftp;
  connectdata *conn;
  _Bool premature_local;
  Curl_easy *pCStack_18;
  CURLcode status_local;
  Curl_easy *data_local;
  
  ftp = (FTP *)data->conn;
  ftpc = (ftp_conn *)(data->req).p.file;
  nread = (ssize_t)&((connectdata *)ftp)->proto;
  rawPath._0_4_ = CURLE_OK;
  pathLen = 0;
  old_time = 0;
  if (ftpc == (ftp_conn *)0x0) {
    return CURLE_OK;
  }
  pp = (pingpong *)nread;
  conn._3_1_ = premature;
  conn._4_4_ = status;
  pCStack_18 = data;
  switch(status) {
  case CURLE_OK:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_PARTIAL_FILE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_WRITE_ERROR:
  case CURLE_UPLOAD_FAILED:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
    if (!premature) goto LAB_0014dcb9;
  }
  (((connectdata *)ftp)->proto).ftpc.ctl_valid = false;
  (((connectdata *)ftp)->proto).ftpc.cwdfail = true;
  Curl_conncontrol((connectdata *)ftp,1);
  rawPath._0_4_ = conn._4_4_;
LAB_0014dcb9:
  if ((*(uint *)&(pCStack_18->state).field_0x6d0 >> 6 & 1) != 0) {
    if (((pCStack_18->set).chunk_end != (curl_chunk_end_callback)0x0) && (pp[1].cache_size != 0)) {
      Curl_set_in_callback(pCStack_18,true);
      (*(pCStack_18->set).chunk_end)((pCStack_18->wildcard).customptr);
      Curl_set_in_callback(pCStack_18,false);
    }
    pp[1].sendbuf.leng = 0xffffffffffffffff;
  }
  if ((CURLcode)rawPath == CURLE_OK) {
    rawPath._0_4_ =
         Curl_urldecode((ftpc->pp).cache,0,(char **)&pathLen,(size_t *)&old_time,REJECT_CTRL);
  }
  if ((CURLcode)rawPath == CURLE_OK) {
    if (((pCStack_18->set).ftp_filemethod == '\x02') && (*(char *)pathLen == '/')) {
      (*Curl_cfree)((void *)pathLen);
    }
    else {
      (*Curl_cfree)((void *)pp[1].sendleft);
      if ((pp[1].field_0x24 & 1) == 0) {
        if ((pCStack_18->set).ftp_filemethod == '\x02') {
          old_time = 0;
        }
        else {
          if (pp[1].cache_size == 0) {
            local_88 = 0;
          }
          else {
            local_88 = strlen((char *)pp[1].cache_size);
          }
          old_time = old_time - local_88;
        }
        *(undefined1 *)(pathLen + old_time) = 0;
        pp[1].sendleft = pathLen;
      }
      else {
        (*Curl_cfree)((void *)pathLen);
        pp[1].sendleft = 0;
      }
    }
    if (pp[1].sendleft != 0) {
      Curl_infof(pCStack_18,"Remembering we are in dir \"%s\"",pp[1].sendleft);
    }
  }
  else {
    *(undefined1 *)((long)&pp[1].linestart_resp + 5) = 0;
    Curl_conncontrol((connectdata *)ftp,1);
    (*Curl_cfree)((void *)pp[1].sendleft);
    pp[1].sendleft = 0;
  }
  freedirs((ftp_conn *)pp);
  if (*(int *)((long)&ftp[0xf].path + 4) != -1) {
    if (((((CURLcode)rawPath == CURLE_OK) && (((ulong)pp[1].linestart_resp & 0x100000000) != 0)) &&
        (0 < (pCStack_18->req).maxdownload)) &&
       (rawPath._0_4_ = Curl_pp_sendf(pCStack_18,(pingpong *)nread,"%s","ABOR"),
       data_00 = pCStack_18, (CURLcode)rawPath != CURLE_OK)) {
      pcVar3 = curl_easy_strerror((CURLcode)rawPath);
      Curl_failf(data_00,"Failure sending ABOR command: %s",pcVar3);
      *(undefined1 *)((long)&pp[1].linestart_resp + 5) = 0;
      Curl_conncontrol((connectdata *)ftp,1);
    }
    if (((ulong)ftp[0x12].path & 1) != 0) {
      Curl_ssl_close(pCStack_18,(connectdata *)ftp,1);
    }
    close_secondarysocket(pCStack_18,(connectdata *)ftp);
  }
  sVar2 = nread;
  if ((((CURLcode)rawPath == CURLE_OK) && ((int)(ftpc->pp).nread_resp == 0)) &&
     ((((ulong)pp[1].linestart_resp & 0x10000000000) != 0 &&
      (((*(byte *)(nread + 0x20) & 1) != 0 && ((conn._3_1_ & 1) == 0)))))) {
    uVar1 = *(undefined8 *)(nread + 0x50);
    *(undefined8 *)(nread + 0x50) = 60000;
    cVar4 = Curl_now();
    *(time_t *)(sVar2 + 0x40) = cVar4.tv_sec;
    *(ulong *)(sVar2 + 0x48) = CONCAT44(uStack_6c,cVar4.tv_usec);
    rawPath._0_4_ = Curl_GetFTPResponse(pCStack_18,(ssize_t *)&result,(int *)((long)&rawPath + 4));
    *(undefined8 *)(nread + 0x50) = uVar1;
    if ((_result == 0) && ((CURLcode)rawPath == CURLE_OPERATION_TIMEDOUT)) {
      Curl_failf(pCStack_18,"control connection looks dead");
      *(undefined1 *)((long)&pp[1].linestart_resp + 5) = 0;
      Curl_conncontrol((connectdata *)ftp,1);
    }
    if ((CURLcode)rawPath != CURLE_OK) {
      (*Curl_cfree)((void *)(ftpc->pp).cache_size);
      (ftpc->pp).cache_size = 0;
      return (CURLcode)rawPath;
    }
    if ((((ulong)pp[1].linestart_resp & 0x100000000) != 0) && (0 < (pCStack_18->req).maxdownload)) {
      Curl_infof(pCStack_18,"partial download completed, closing connection");
      Curl_conncontrol((connectdata *)ftp,1);
      return (CURLcode)rawPath;
    }
    if (((((ulong)pp[1].linestart_resp & 0x100000000) == 0) && (rawPath._4_4_ != 0xe2)) &&
       (rawPath._4_4_ != 0xfa)) {
      if (rawPath._4_4_ == 0x228) {
        Curl_failf(pCStack_18,"Exceeded storage allocation");
        rawPath._0_4_ = CURLE_REMOTE_DISK_FULL;
      }
      else {
        Curl_failf(pCStack_18,"server did not report OK, got %d",(ulong)rawPath._4_4_);
        rawPath._0_4_ = CURLE_PARTIAL_FILE;
      }
    }
  }
  if (((CURLcode)rawPath == CURLE_OK) && ((conn._3_1_ & 1) == 0)) {
    if ((*(ulong *)&(pCStack_18->set).field_0x8e2 >> 0x1a & 1) == 0) {
      if ((((pCStack_18->req).size == -1) || ((pCStack_18->req).size == (pCStack_18->req).bytecount)
          ) || (((pCStack_18->req).size + (pCStack_18->state).crlf_conversions ==
                 (pCStack_18->req).bytecount ||
                ((pCStack_18->req).maxdownload == (pCStack_18->req).bytecount)))) {
        if (((((ulong)pp[1].linestart_resp & 0x100000000) == 0) &&
            ((pCStack_18->req).bytecount == 0)) && (0 < (pCStack_18->req).size)) {
          Curl_failf(pCStack_18,"No data was received");
          rawPath._0_4_ = CURLE_FTP_COULDNT_RETR_FILE;
        }
      }
      else {
        Curl_failf(pCStack_18,"Received only partial file: %ld bytes",(pCStack_18->req).bytecount);
        rawPath._0_4_ = CURLE_PARTIAL_FILE;
      }
    }
    else if ((((pCStack_18->state).infilesize != -1) &&
             ((pCStack_18->state).infilesize != (pCStack_18->req).writebytecount)) &&
            (((*(ulong *)&(pCStack_18->set).field_0x8e2 >> 3 & 1) == 0 &&
             ((int)(ftpc->pp).nread_resp == 0)))) {
      Curl_failf(pCStack_18,"Uploaded unaligned file size (%ld out of %ld bytes)",
                 (pCStack_18->req).writebytecount,(pCStack_18->state).infilesize);
      rawPath._0_4_ = CURLE_PARTIAL_FILE;
    }
  }
  *(undefined4 *)&(ftpc->pp).nread_resp = 0;
  *(undefined1 *)((long)&pp[1].linestart_resp + 4) = 0;
  if (((conn._4_4_ == CURLE_OK) && ((CURLcode)rawPath == CURLE_OK)) &&
     (((conn._3_1_ & 1) == 0 && ((pCStack_18->set).postquote != (curl_slist *)0x0)))) {
    rawPath._0_4_ = ftp_sendquote(pCStack_18,(connectdata *)ftp,(pCStack_18->set).postquote);
  }
  (*Curl_cfree)((void *)(ftpc->pp).cache_size);
  (ftpc->pp).cache_size = 0;
  return (CURLcode)rawPath;
}

Assistant:

static CURLcode ftp_done(struct Curl_easy *data, CURLcode status,
                         bool premature)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL;
  size_t pathLen = 0;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the url-decoded "raw" path */
    result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen,
                            REJECT_CTRL);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    free(ftpc->prevpath);
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else { /* remember working directory for connection reuse */
    if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
      free(rawPath); /* full path => no CWDs happened => keep ftpc->prevpath */
    else {
      free(ftpc->prevpath);

      if(!ftpc->cwdfail) {
        if(data->set.ftp_filemethod == FTPFILE_NOCWD)
          pathLen = 0; /* relative path => working directory is FTP home */
        else
          pathLen -= ftpc->file?strlen(ftpc->file):0; /* file is url-decoded */

        rawPath[pathLen] = '\0';
        ftpc->prevpath = rawPath;
      }
      else {
        free(rawPath);
        ftpc->prevpath = NULL; /* no path */
      }
    }

    if(ftpc->prevpath)
      infof(data, "Remembering we are in dir \"%s\"", ftpc->prevpath);
  }

  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(data, pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(data, conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(data, conn);
  }

  if(!result && (ftp->transfer == PPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    timediff_t old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(data, &nread, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result) {
      Curl_safefree(ftp->pathalloc);
      return result;
    }

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      switch(ftpcode) {
      case 226:
      case 250:
        break;
      case 552:
        failf(data, "Exceeded storage allocation");
        result = CURLE_REMOTE_DISK_FULL;
        break;
      default:
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
        break;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == PPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.writebytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = PPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(data, conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}